

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedDatum.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::FixedDatum::GetDatumValue(FixedDatum *this,KOCTET *Buffer,KUINT16 BufferSize)

{
  KException *this_00;
  allocator<char> local_39;
  KString local_38;
  
  if (3 < BufferSize) {
    *(undefined4 *)Buffer = *(undefined4 *)this->m_cDatumValue;
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"GetDatumValue",&local_39);
  KException::KException(this_00,&local_38,1);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void FixedDatum::GetDatumValue(KOCTET *Buffer, KUINT16 BufferSize) const noexcept(false)
{
    if( BufferSize < 4 )throw KException( __FUNCTION__, BUFFER_TOO_SMALL );
	memcpy( Buffer, m_cDatumValue, 4 );
}